

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH_errorcode
VELOCYPACK_XXH3_128bits_reset_withSecret(XXH3_state_t *statePtr,void *secret,size_t secretSize)

{
  ulong in_RDX;
  size_t in_RSI;
  void *in_RDI;
  XXH3_state_t *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  XXH_errorcode XVar1;
  
  if (in_RDI == (void *)0x0) {
    XVar1 = XXH_ERROR;
  }
  else {
    XXH3_reset_internal(unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        in_RDI,in_RSI);
    if (in_RSI == 0) {
      XVar1 = XXH_ERROR;
    }
    else if (in_RDX < 0x88) {
      XVar1 = XXH_ERROR;
    }
    else {
      XVar1 = XXH_OK;
    }
  }
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH3_128bits_reset_withSecret(
    XXH3_state_t* statePtr, const void* secret, size_t secretSize) {
  if (statePtr == NULL) return XXH_ERROR;
  XXH3_reset_internal(statePtr, 0, secret, secretSize);
  if (secret == NULL) return XXH_ERROR;
  if (secretSize < XXH3_SECRET_SIZE_MIN) return XXH_ERROR;
  return XXH_OK;
}